

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrismaticJoint.cpp
# Opt level: O0

void __thiscall iDynTree::PrismaticJoint::PrismaticJoint(PrismaticJoint *this,PrismaticJoint *other)

{
  undefined8 uVar1;
  long *in_RSI;
  long *in_RDI;
  double in_stack_000000e8;
  PrismaticJoint *in_stack_000000f0;
  MovableJointImpl<1U,_1U> *in_stack_ffffffffffffffd0;
  
  MovableJointImpl<1U,_1U>::MovableJointImpl(in_stack_ffffffffffffffd0);
  *in_RDI = (long)&PTR__PrismaticJoint_004fa420;
  in_RDI[4] = in_RSI[4];
  in_RDI[5] = in_RSI[5];
  iDynTree::Transform::Transform((Transform *)(in_RDI + 6),(Transform *)(in_RSI + 6));
  iDynTree::Axis::Axis((Axis *)(in_RDI + 0x12),(Axis *)(in_RSI + 0x12));
  *(byte *)(in_RDI + 0x18) = *(byte *)(in_RSI + 0x18) & 1;
  in_RDI[0x19] = in_RSI[0x19];
  in_RDI[0x1a] = in_RSI[0x1a];
  *(int *)(in_RDI + 0x1b) = (int)in_RSI[0x1b];
  in_RDI[0x1c] = in_RSI[0x1c];
  in_RDI[0x1d] = in_RSI[0x1d];
  iDynTree::Transform::Transform((Transform *)(in_RDI + 0x1f));
  iDynTree::Transform::Transform((Transform *)(in_RDI + 0x2b));
  SpatialMotionVector::SpatialMotionVector((SpatialMotionVector *)0x4671bc);
  SpatialMotionVector::SpatialMotionVector((SpatialMotionVector *)0x4671cf);
  uVar1 = (**(code **)(*in_RSI + 0xb0))();
  (**(code **)(*in_RDI + 0xa8))(in_RDI,uVar1);
  uVar1 = (**(code **)(*in_RSI + 0xc0))();
  (**(code **)(*in_RDI + 0xb8))(in_RDI,uVar1);
  resetAxisBuffers(in_stack_000000f0);
  resetBuffers(in_stack_000000f0,in_stack_000000e8);
  return;
}

Assistant:

PrismaticJoint::PrismaticJoint(const PrismaticJoint& other):
                             link1(other.link1), link2(other.link2),
                             link1_X_link2_at_rest(other.link1_X_link2_at_rest),
                             translation_axis_wrt_link1(other.translation_axis_wrt_link1),
                             m_hasPosLimits(other.m_hasPosLimits),
                             m_minPos(other.m_minPos), m_maxPos(other.m_maxPos),
                             m_joint_dynamics_type(other.m_joint_dynamics_type),
                             m_damping(other.m_damping), m_static_friction(other.m_static_friction)
{
    this->setPosCoordsOffset(other.getPosCoordsOffset());
    this->setDOFsOffset(other.getDOFsOffset());

    this->resetAxisBuffers();
    this->resetBuffers(0);
}